

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O0

bool luna::operator==(Value *left,Value *right)

{
  Value *right_local;
  Value *left_local;
  bool local_1;
  
  if (left->type_ == right->type_) {
    switch(left->type_) {
    case ValueT_Nil:
      local_1 = true;
      break;
    case ValueT_Bool:
      local_1 = ((left->field_0).bvalue_ & 1U) == ((right->field_0).bvalue_ & 1U);
      break;
    case ValueT_Number:
      local_1 = (left->field_0).num_ == (right->field_0).num_;
      break;
    case ValueT_Obj:
      local_1 = (left->field_0).obj_ == (right->field_0).obj_;
      break;
    case ValueT_String:
      local_1 = (left->field_0).obj_ == (right->field_0).obj_;
      break;
    case ValueT_Closure:
      local_1 = (left->field_0).obj_ == (right->field_0).obj_;
      break;
    case ValueT_Upvalue:
      local_1 = (left->field_0).obj_ == (right->field_0).obj_;
      break;
    case ValueT_Table:
      local_1 = (left->field_0).obj_ == (right->field_0).obj_;
      break;
    case ValueT_UserData:
      local_1 = (left->field_0).obj_ == (right->field_0).obj_;
      break;
    case ValueT_CFunction:
      local_1 = (left->field_0).obj_ == (right->field_0).obj_;
      break;
    default:
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool operator == (const Value &left, const Value &right)
    {
        if (left.type_ != right.type_)
            return false;

        switch (left.type_)
        {
            case ValueT_Nil: return true;
            case ValueT_Bool: return left.bvalue_ == right.bvalue_;
            case ValueT_Number: return left.num_ == right.num_;
            case ValueT_Obj: return left.obj_ == right.obj_;
            case ValueT_String: return left.str_ == right.str_;
            case ValueT_Closure: return left.closure_ == right.closure_;
            case ValueT_Upvalue: return left.upvalue_ == right.upvalue_;
            case ValueT_Table: return left.table_ == right.table_;
            case ValueT_UserData: return left.user_data_ == right.user_data_;
            case ValueT_CFunction: return left.cfunc_ == right.cfunc_;
        }

        return false;
    }